

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

nanoseconds binlog::ticksToNanoseconds(uint64_t frequency,int64_t ticks)

{
  return (nanoseconds)
         (((ticks % (long)frequency) * 1000000000) / (long)frequency +
         (ticks / (long)frequency) * 1000000000);
}

Assistant:

std::chrono::nanoseconds ticksToNanoseconds(std::uint64_t frequency, std::int64_t ticks)
{
  // Compute `ticks * std::nano::den / frequency`.
  // To avoid `ticks * std::nano::den` overflowing, assume that:
  //   ticks = q*f + r    and     r < f
  // then multiply and divide the additives one by one.
  // We assume that the result fits on 64 bits, as that many nanos cover a long timespan.
  const std::int64_t sf = std::int64_t(frequency);
  const std::int64_t q = ticks / sf;
  const std::int64_t r = ticks % sf;
  return std::chrono::nanoseconds{q * std::nano::den + r * std::nano::den / sf};
}